

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# differentiable.cxx
# Opt level: O3

void __thiscall
DifferentialEquation::setTerm
          (DifferentialEquation *this,int n,StochasticFunction *integrand,
          StochasticVariable *integrator)

{
  int iVar1;
  pointer ppSVar2;
  pointer ppSVar3;
  Unit local_160;
  Unit local_f8;
  Unit local_90;
  
  iVar1 = this->eqnTermAmount;
  if (n < iVar1) {
    ppSVar3 = (this->eqnIntegrands).
              super__Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar3[n] != (StochasticFunction *)0x0) {
      (**(code **)((long)(ppSVar3[n]->super_StochasticProcess).super_Parametric._vptr_Parametric + 8
                  ))();
      ppSVar3 = (this->eqnIntegrands).
                super__Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      iVar1 = this->eqnTermAmount;
    }
    ppSVar3[n] = integrand;
  }
  if (n < iVar1) {
    ppSVar2 = (this->eqnIntegrators).
              super__Vector_base<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar2[n] != (StochasticVariable *)0x0) {
      (**(code **)((long)(ppSVar2[n]->super_StochasticProcess).super_Parametric._vptr_Parametric + 8
                  ))();
      ppSVar2 = (this->eqnIntegrators).
                super__Vector_base<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    }
    ppSVar2[n] = integrator;
  }
  (*(integrand->super_StochasticProcess).super_Physical._vptr_Physical[10])
            (&local_f8,&(integrand->super_StochasticProcess).super_Physical);
  (*(integrator->super_StochasticProcess).super_Physical._vptr_Physical[10])
            (&local_160,&(integrator->super_StochasticProcess).super_Physical);
  operator*(&local_90,&local_f8,&local_160);
  Unit::operator+=(&(this->super_StochasticVariable).super_StochasticProcess.super_Physical.
                    physicalUnit,&local_90);
  Unit::~Unit(&local_90);
  Unit::~Unit(&local_160);
  Unit::~Unit(&local_f8);
  return;
}

Assistant:

void DifferentialEquation::setTerm(int n, StochasticFunction *integrand, StochasticVariable *integrator)
{
	if(n<eqnTermAmount) {
		delete eqnIntegrands[n];
		eqnIntegrands[n] = integrand;
	}
	if(n<eqnTermAmount) {
		delete eqnIntegrators[n];
		eqnIntegrators[n] = integrator;
	}
	physicalUnit += integrand->getUnit() * integrator->getUnit();
}